

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

void __thiscall
wasm::IRBuilder::ChildPopper::ConstraintCollector::visitIf(ConstraintCollector *this,If *curr)

{
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  *this_00;
  Subtype local_38;
  undefined1 local_30 [24];
  If *local_18;
  If *curr_local;
  ConstraintCollector *this_local;
  
  this_00 = this->children;
  local_30._0_8_ = &curr->condition;
  local_18 = curr;
  curr_local = (If *)this;
  wasm::Type::Type(&local_38.bound,i32);
  std::
  variant<wasm::IRBuilder::ChildPopper::Subtype,wasm::IRBuilder::ChildPopper::AnyType,wasm::IRBuilder::ChildPopper::AnyReference,wasm::IRBuilder::ChildPopper::AnyTuple,wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  ::
  variant<wasm::IRBuilder::ChildPopper::Subtype,void,void,wasm::IRBuilder::ChildPopper::Subtype,void>
            ((variant<wasm::IRBuilder::ChildPopper::Subtype,wasm::IRBuilder::ChildPopper::AnyType,wasm::IRBuilder::ChildPopper::AnyReference,wasm::IRBuilder::ChildPopper::AnyTuple,wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
              *)(local_30 + 8),&local_38);
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::push_back(this_00,(value_type *)local_30);
  return;
}

Assistant:

void visitIf(If* curr) {
      // Skip the control flow children because we only want to pop the
      // condition.
      children.push_back({&curr->condition, {Subtype{Type::i32}}});
    }